

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmCpRestore<(moira::Instr)150,(moira::Mode)3,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  Av<(moira::Instr)150,_(moira::Mode)3,_2> local_40 [2];
  undefined1 local_38 [8];
  Ea<(moira::Mode)3,_2> ea;
  u8 id;
  u8 dn;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  ea.ext2._2_2_ = op;
  unique0x100000fe = addr;
  if ((str->style->syntax == GNU) || (str->style->syntax == GNU_MIT)) {
    dasmIllegal<(moira::Instr)150,(moira::Mode)3,2>(this,str,addr,op);
  }
  else {
    ea.ext2._1_1_ = (byte)op & 7;
    ea.ext2._0_1_ = (byte)((int)(uint)op >> 9) & 7;
    Op<(moira::Mode)3,2>((Ea<(moira::Mode)3,_2> *)local_38,this,(ushort)ea.ext2._1_1_,addr);
    pSVar1 = StrWriter::operator<<(str,(uint)(byte)ea.ext2);
    pSVar1 = StrWriter::operator<<(pSVar1);
    pSVar1 = StrWriter::operator<<(pSVar1," ");
    StrWriter::operator<<(pSVar1,(Ea<(moira::Mode)3,_2> *)local_38);
    local_40[0].ext1 = 0;
    StrWriter::operator<<(str,local_40);
  }
  return;
}

Assistant:

void
Moira::dasmCpRestore(StrWriter &str, u32 &addr, u16 op) const
{
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        dasmIllegal<I, M, S>(str, addr, op);
        return;
    }

    auto dn = ( _____________xxx(op) );
    auto id = ( ____xxx_________(op) );
    auto ea = Op <M,S> (dn, addr);

    str << id << Ins<I>{} << " " << ea;
    str << Av<I, M, S>{};
}